

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

void cupdlp_diffTwoNormSquared
               (CUPDLPwork *w,cupdlp_float *x,cupdlp_float *y,cupdlp_int len,cupdlp_float *res)

{
  CUPDLPwork *w_00;
  
  memcpy(w->buffer2,x,(long)len * 8);
  w_00 = (CUPDLPwork *)w->buffer2;
  AddToVector((cupdlp_float *)w_00,-1.0,y,len);
  cupdlp_twoNormSquared(w_00,len,w->buffer2,res);
  return;
}

Assistant:

void cupdlp_diffTwoNormSquared(CUPDLPwork *w, const cupdlp_float *x,
                               const cupdlp_float *y, const cupdlp_int len,
                               cupdlp_float *res) {
  CUPDLP_COPY_VEC(w->buffer2, x, cupdlp_float, len);
  cupdlp_float alpha = -1.0;
  cupdlp_axpy(w, len, &alpha, y, w->buffer2);
  cupdlp_twoNormSquared(w, len, w->buffer2, res);
}